

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::Find(ON_wString *this,wchar_t *wcharString,size_t start_index)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  bool bVar4;
  int element_count1;
  ON_Internal_Empty_wString *pOVar5;
  wchar_t *string1;
  wchar_t *pwVar6;
  
  if ((start_index < 0x7fffffff) && (element_count1 = Length(wcharString), 0 < element_count1)) {
    pwVar3 = this->m_s;
    pOVar5 = &empty_wstring;
    if (pwVar3 != (wchar_t *)0x0) {
      pOVar5 = (ON_Internal_Empty_wString *)(pwVar3 + -3);
    }
    iVar1 = (pOVar5->header).string_length;
    if (element_count1 <= iVar1 - (int)start_index && (int)start_index < iVar1) {
      wVar2 = *wcharString;
      string1 = pwVar3 + start_index;
      pwVar6 = string1;
      for (; string1 <= pwVar3 + (iVar1 - element_count1); string1 = string1 + 1) {
        if ((wVar2 == *string1) &&
           (bVar4 = EqualOrdinal(string1,element_count1,wcharString,element_count1,false), bVar4)) {
          return (int)((ulong)((long)pwVar6 - (long)this->m_s) >> 2);
        }
        pwVar6 = pwVar6 + 1;
      }
    }
  }
  return -1;
}

Assistant:

int ON_wString::Find(
  const wchar_t* wcharString,
  size_t start_index
  ) const
{
  if ( start_index < 0x7FFFFFFF )
  {
    const int start_index_as_int = (int)start_index;
    const int length = ON_wString::Length(wcharString);
    if (length > 0)
    {
      const int this_length = Length();
      if ( start_index_as_int < this_length && (this_length - start_index_as_int) >= length )
      {
        const wchar_t w0 = wcharString[0];
        const wchar_t* p1 = m_s + (this_length - length);
        for (const wchar_t* p = m_s + start_index_as_int; p <= p1; p++)
        {
          if (w0 == p[0] && ON_wString::EqualOrdinal(p, length, wcharString, length, false) )
            return ((int)(p - m_s));
        }
      }
    }
  }
  return -1;
}